

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

Matrix * MatrixAddition(Matrix *a,Matrix *b)

{
  uint uVar1;
  Real *__dest;
  Real *pRVar2;
  undefined8 in_RAX;
  Matrix *pMVar3;
  long lVar4;
  uint uVar5;
  
  uVar1 = a->rows;
  if ((uVar1 == b->rows) && (a->columns == b->columns)) {
    pMVar3 = MatrixZero(uVar1,a->columns);
    __dest = pMVar3->matrix;
    uVar1 = pMVar3->rows;
    uVar5 = pMVar3->columns;
    memcpy(__dest,a->matrix,(ulong)uVar1 * (ulong)uVar5 * 0x10);
    uVar5 = uVar5 * uVar1;
    if (uVar5 != 0) {
      pRVar2 = b->matrix;
      lVar4 = 0;
      do {
        *(longdouble *)((long)__dest + lVar4) =
             *(longdouble *)((long)__dest + lVar4) + *(longdouble *)((long)pRVar2 + lVar4);
        lVar4 = lVar4 + 0x10;
      } while ((ulong)uVar5 << 4 != lVar4);
    }
  }
  else {
    pMVar3 = (Matrix *)0x0;
    fprintf(_stderr,"%s: Invalid dimension (%dx%d == %dx%d)\n","MatrixAddition",(ulong)uVar1,
            (ulong)a->columns,(ulong)b->rows,CONCAT44((int)((ulong)in_RAX >> 0x20),b->columns));
  }
  return pMVar3;
}

Assistant:

Matrix *MatrixAddition(const Matrix *a, const Matrix *b) {
#ifndef NDEBUG
  if (a->rows != b->rows || a->columns != b->columns) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d == %dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns, b->rows, b->columns);
    return NULL;
  }
#endif
  Matrix *new = MatrixClone(a);
  for (uint64_t index = 0; index < new->rows * new->columns; ++index) {
    new->matrix[index] += b->matrix[index];
  }
  return new;
}